

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-desc.c
# Opt level: O3

size_t obj_desc_aware(object *obj,char *buf,size_t max,size_t end)

{
  _Bool _Var1;
  char *fmt;
  size_t local_20;
  
  local_20 = end;
  _Var1 = object_flavor_is_aware(obj);
  if (_Var1) {
    _Var1 = object_runes_known(obj);
    if (_Var1) {
      if (obj->known->curses == (curse_data *)0x0) {
        return local_20;
      }
      fmt = " {cursed}";
    }
    else {
      fmt = " {??}";
    }
  }
  else {
    fmt = " {unseen}";
  }
  strnfcat(buf,max,&local_20,fmt);
  return local_20;
}

Assistant:

static size_t obj_desc_aware(const struct object *obj, char *buf, size_t max,
							 size_t end)
{
	if (!object_flavor_is_aware(obj)) {
		strnfcat(buf, max, &end, " {unseen}");
	} else if (!object_runes_known(obj)) {
		strnfcat(buf, max, &end, " {??}");
	} else if (obj->known->curses) {
		strnfcat(buf, max, &end, " {cursed}");
	}

	return end;
}